

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectBase.hpp
# Opt level: O0

void __thiscall
Diligent::
DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
::~DeviceObjectBase(DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
                    *this)

{
  IMemoryAllocator *pIVar1;
  DeviceObjectBase<Diligent::IDeviceMemoryVk,_Diligent::RenderDeviceVkImpl,_Diligent::DeviceMemoryDesc>
  *this_local;
  
  (this->super_ObjectBase<Diligent::IDeviceMemoryVk>).
  super_RefCountedObject<Diligent::IDeviceMemoryVk>.super_IDeviceMemoryVk.super_IDeviceMemory.
  super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)&PTR_QueryInterface_013a2758;
  pIVar1 = GetStringAllocator();
  (*pIVar1->_vptr_IMemoryAllocator[1])(pIVar1,(this->m_Desc).super_DeviceObjectAttribs.Name);
  if ((this->m_bIsDeviceInternal & 1U) == 0) {
    RenderDeviceBase<Diligent::EngineVkImplTraits>::Release
              ((RenderDeviceBase<Diligent::EngineVkImplTraits> *)this->m_pDevice);
  }
  RefCntAutoPtr<Diligent::IObject>::~RefCntAutoPtr(&this->m_pUserData);
  ObjectBase<Diligent::IDeviceMemoryVk>::~ObjectBase
            (&this->super_ObjectBase<Diligent::IDeviceMemoryVk>);
  return;
}

Assistant:

virtual ~DeviceObjectBase()
    {
        FREE(GetStringAllocator(), const_cast<Char*>(m_Desc.Name));

        if (!m_bIsDeviceInternal)
        {
            m_pDevice->Release();
        }
    }